

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O1

SRes SkipBitUi32s(CSzData *sd,UInt32 numItems)

{
  byte *pbVar1;
  Byte *pBVar2;
  SRes SVar3;
  ulong uVar4;
  ulong uVar5;
  byte *pbVar6;
  uint uVar7;
  UInt32 numDefined;
  UInt32 UVar8;
  byte bVar9;
  
  SVar3 = 0x10;
  if (sd->Size != 0) {
    uVar4 = sd->Size - 1;
    sd->Size = uVar4;
    pBVar2 = sd->Data;
    pbVar1 = pBVar2 + 1;
    sd->Data = pbVar1;
    if (*pBVar2 == '\0') {
      uVar5 = (ulong)(numItems + 7 >> 3);
      if (uVar5 <= uVar4) {
        UVar8 = 0;
        if (numItems != 0) {
          uVar7 = 0;
          bVar9 = 0;
          pbVar6 = pbVar1;
          do {
            if (uVar7 == 0) {
              bVar9 = *pbVar6;
              pbVar6 = pbVar6 + 1;
              uVar7 = 8;
            }
            uVar7 = uVar7 - 1;
            UVar8 = UVar8 + ((bVar9 >> (uVar7 & 0x1f) & 1) != 0);
            numItems = numItems - 1;
          } while (numItems != 0);
        }
        sd->Size = uVar4 - uVar5;
        sd->Data = pbVar1 + uVar5;
        numItems = UVar8;
      }
      if (uVar4 < uVar5) {
        return 0x10;
      }
    }
    uVar4 = (ulong)numItems;
    if (uVar4 <= sd->Size >> 2) {
      sd->Size = sd->Size + uVar4 * -4;
      sd->Data = sd->Data + uVar4 * 4;
      SVar3 = 0;
    }
  }
  return SVar3;
}

Assistant:

static SRes SkipBitUi32s(CSzData *sd, UInt32 numItems)
{
  Byte allAreDefined;
  UInt32 numDefined = numItems;
  SZ_READ_BYTE(allAreDefined);
  if (!allAreDefined)
  {
    size_t numBytes = (numItems + 7) >> 3;
    if (numBytes > sd->Size)
      return SZ_ERROR_ARCHIVE;
    numDefined = CountDefinedBits(sd->Data, numItems);
    SKIP_DATA(sd, numBytes);
  }
  if (numDefined > (sd->Size >> 2))
    return SZ_ERROR_ARCHIVE;
  SKIP_DATA(sd, (size_t)numDefined * 4);
  return SZ_OK;
}